

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

Data * __thiscall Function::eval(Function *this,vector<Data_*,_std::allocator<Data_*>_> *parasData)

{
  bool bVar1;
  int iVar2;
  Runtime *this_00;
  reference name;
  _Self *__y;
  undefined4 extraout_var;
  reference ppAVar3;
  undefined4 extraout_var_00;
  reference ppDVar4;
  Data **i;
  iterator __end1;
  iterator __begin1;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  _List_iterator<Atom_*> local_70;
  _Self local_68;
  iterator bracketsCursor;
  _Self local_50;
  __normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_> local_48;
  iterator parasDataCursor;
  iterator parasCursor;
  Runtime *runtime;
  Data *result;
  vector<Data_*,_std::allocator<Data_*>_> *parasData_local;
  Function *this_local;
  
  this_00 = (Runtime *)operator_new(8);
  Runtime::Runtime(this_00);
  parasDataCursor._M_current =
       (Data **)std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&this->paras);
  local_48._M_current = (Data **)std::vector<Data_*,_std::allocator<Data_*>_>::begin(parasData);
  while( true ) {
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->paras);
    bVar1 = std::operator!=((_Self *)&parasDataCursor,&local_50);
    if (!bVar1) break;
    name = std::
           _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&parasDataCursor);
    ppDVar4 = __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::
              operator*(&local_48);
    Runtime::assignVarToTop(this_00,name,*ppDVar4);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&parasDataCursor,0);
    bracketsCursor._M_node =
         (_List_node_base *)
         __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::
         operator++(&local_48,0);
  }
  local_68._M_node =
       (_List_node_base *)std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin(&this->body);
  while( true ) {
    local_70._M_node =
         (_List_node_base *)std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::end(&this->body);
    __y = std::_List_iterator<Atom_*>::operator--(&local_70);
    bVar1 = std::operator!=(&local_68,__y);
    if (!bVar1) break;
    ppAVar3 = std::_List_iterator<Atom_*>::operator*(&local_68);
    iVar2 = (*(*ppAVar3)->_vptr_Atom[3])();
    Data::check((Data *)CONCAT44(extraout_var,iVar2));
    std::_List_iterator<Atom_*>::operator++(&local_68,0);
  }
  ppAVar3 = std::_List_iterator<Atom_*>::operator*(&local_68);
  iVar2 = (*(*ppAVar3)->_vptr_Atom[3])(*ppAVar3,this_00);
  __end1 = std::vector<Data_*,_std::allocator<Data_*>_>::begin(parasData);
  i = (Data **)std::vector<Data_*,_std::allocator<Data_*>_>::end(parasData);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppDVar4 = __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::
              operator*(&__end1);
    Data::check(*ppDVar4);
    __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::operator++
              (&__end1);
  }
  if (parasData != (vector<Data_*,_std::allocator<Data_*>_> *)0x0) {
    std::vector<Data_*,_std::allocator<Data_*>_>::~vector(parasData);
    operator_delete(parasData);
  }
  if (this_00 != (Runtime *)0x0) {
    Runtime::~Runtime(this_00);
    operator_delete(this_00);
  }
  return (Data *)CONCAT44(extraout_var_00,iVar2);
}

Assistant:

Data *Function::eval(std::vector<Data *> *parasData) {
    Data *result;
    auto runtime = new Runtime();
    auto parasCursor = paras.begin();
    auto parasDataCursor = parasData->begin();
    while (parasCursor != paras.end()) {
        runtime->assignVarToTop(*parasCursor, *parasDataCursor);
        parasCursor++;
        parasDataCursor++;
    }
    auto bracketsCursor = body.begin();
    while (bracketsCursor != (--body.end())) {
        result = (*bracketsCursor)->eval(runtime);
        Data::check(result);
        bracketsCursor++;
    }
    result = (*bracketsCursor)->eval(runtime);
    for (auto &i: *parasData) {
        Data::check(i);
    }
    delete parasData;
    delete runtime;
    return result;
}